

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShiftRoll.hpp
# Opt level: O0

void InstructionSet::x86::Primitive::
     rcl<unsigned_char,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
               (modify_t<unsigned_char> destination,uint8_t count,Context *context)

{
  byte bVar1;
  uchar uVar2;
  byte bVar3;
  long lVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  byte local_25;
  uchar temp_carry_1;
  uchar temp_carry;
  uchar carry;
  int temp_count;
  Context *context_local;
  uint8_t count_local;
  modify_t<unsigned_char> destination_local;
  
  iVar7 = Numeric::bit_size<unsigned_char>();
  lVar4 = (long)(ulong)count % (long)(iVar7 + 1);
  iVar7 = (int)lVar4;
  local_25 = Flags::carry_bit<unsigned_char>(&context->flags);
  if (iVar7 != 0) {
    if (iVar7 == 8) {
      bVar1 = *destination;
      bVar3 = *destination;
      iVar7 = Numeric::bit_size<unsigned_char>();
      *destination = (byte)((int)(uint)bVar3 >> 1) | local_25 << ((char)iVar7 - 1U & 0x1f);
      local_25 = bVar1 & 1;
    }
    else {
      bVar1 = *destination;
      bVar6 = Numeric::top_bit<unsigned_char>();
      bVar5 = (byte)lVar4;
      uVar2 = *destination;
      bVar3 = *destination;
      iVar7 = Numeric::bit_size<unsigned_char>();
      *destination = uVar2 << (bVar5 & 0x1f) |
                     (byte)((int)(uint)bVar3 >> (((char)iVar7 + '\x01') - bVar5 & 0x1f)) |
                     local_25 << (bVar5 - 1 & 0x1f);
      local_25 = (bVar1 & (byte)((int)(uint)bVar6 >> (bVar5 - 1 & 0x1f))) != 0;
    }
  }
  Flags::set_from<(InstructionSet::x86::Flag)0>(&context->flags,(uint)local_25);
  bVar1 = *destination;
  iVar7 = Numeric::bit_size<unsigned_char>();
  Flags::set_from<(InstructionSet::x86::Flag)3>
            (&context->flags,(int)(uint)bVar1 >> ((char)iVar7 - 1U & 0x1f) & 1U ^ (uint)local_25);
  return;
}

Assistant:

void rcl(
	modify_t<IntT> destination,
	uint8_t count,
	ContextT &context
) {
	/*
		(* RCL and RCR instructions *)
		SIZE ← OperandSize
		CASE (determine count) OF
			SIZE = 8:	tempCOUNT ← (COUNT AND 1FH) MOD 9;
			SIZE = 16:	tempCOUNT ← (COUNT AND 1FH) MOD 17;
			SIZE = 32:	tempCOUNT ← COUNT AND 1FH;
		ESAC;
	*/
	/*
		(* RCL instruction operation *)
		WHILE (tempCOUNT ≠ 0)
			DO
				tempCF ← MSB(DEST);
				DEST ← (DEST * 2) + CF;
				CF ← tempCF;
				tempCOUNT ← tempCOUNT – 1;
			OD;
		ELIHW;
		IF COUNT = 1
			THEN OF ← MSB(DEST) XOR CF;
			ELSE OF is undefined;
		FI;
	*/
	/*
		The CF flag contains the value of the bit shifted into it.
		The OF flag is affected only for single- bit rotates (see “Description” above);
		it is undefined for multi-bit rotates. The SF, ZF, AF, and PF flags are not affected.
	*/
	const auto temp_count = count % (Numeric::bit_size<IntT>() + 1);
	auto carry = context.flags.template carry_bit<IntT>();
	switch(temp_count) {
		case 0: break;
		case Numeric::bit_size<IntT>(): {
			const IntT temp_carry = destination & 1;
			destination = IntT((destination >> 1) | (carry << (Numeric::bit_size<IntT>() - 1)));
			carry = temp_carry;
		} break;
		default: {
			const IntT temp_carry = destination & (Numeric::top_bit<IntT>() >> (temp_count - 1));
			destination = IntT(
				(destination << temp_count) |
				(destination >> (Numeric::bit_size<IntT>() + 1 - temp_count)) |
				(carry << (temp_count - 1))
			);
			carry = temp_carry ? 1 : 0;
		} break;
	}

	context.flags.template set_from<Flag::Carry>(carry);
	context.flags.template set_from<Flag::Overflow>(
		((destination >> (Numeric::bit_size<IntT>() - 1)) & 1) ^ carry
	);
}